

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O1

X509_EXTENSION *
X509_EXTENSION_create_by_OBJ(X509_EXTENSION **ex,ASN1_OBJECT *obj,int crit,ASN1_OCTET_STRING *data)

{
  int iVar1;
  X509_EXTENSION *ex_00;
  
  if (((ex != (X509_EXTENSION **)0x0) && (ex_00 = *ex, ex_00 != (X509_EXTENSION *)0x0)) ||
     (ex_00 = X509_EXTENSION_new(), ex_00 != (X509_EXTENSION *)0x0)) {
    iVar1 = X509_EXTENSION_set_object(ex_00,obj);
    if (iVar1 != 0) {
      ex_00->critical = -(uint)(crit == 0) | 0xff;
      iVar1 = ASN1_OCTET_STRING_set(ex_00->value,data->data,data->length);
      if (iVar1 != 0) {
        if (ex == (X509_EXTENSION **)0x0) {
          return ex_00;
        }
        if (*ex != (X509_EXTENSION *)0x0) {
          return ex_00;
        }
        *ex = ex_00;
        return ex_00;
      }
    }
    if ((ex == (X509_EXTENSION **)0x0) || (ex_00 != *ex)) {
      X509_EXTENSION_free(ex_00);
    }
  }
  return (X509_EXTENSION *)0x0;
}

Assistant:

X509_EXTENSION *X509_EXTENSION_create_by_OBJ(X509_EXTENSION **ex,
                                             const ASN1_OBJECT *obj, int crit,
                                             const ASN1_OCTET_STRING *data) {
  X509_EXTENSION *ret;

  if ((ex == NULL) || (*ex == NULL)) {
    if ((ret = X509_EXTENSION_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *ex;
  }

  if (!X509_EXTENSION_set_object(ret, obj)) {
    goto err;
  }
  if (!X509_EXTENSION_set_critical(ret, crit)) {
    goto err;
  }
  if (!X509_EXTENSION_set_data(ret, data)) {
    goto err;
  }

  if ((ex != NULL) && (*ex == NULL)) {
    *ex = ret;
  }
  return ret;
err:
  if ((ex == NULL) || (ret != *ex)) {
    X509_EXTENSION_free(ret);
  }
  return NULL;
}